

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assert.h
# Opt level: O1

void ut::
     are_equal<agge::tests::mocks::coords_pair<float>,2ul,std::vector<agge::tests::mocks::coords_pair<float>,std::allocator<agge::tests::mocks::coords_pair<float>>>>
               (coords_pair<float> (*expected) [2],
               vector<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
               *actual,LocationInfo *location)

{
  coords_pair<float> *rhs;
  bool bVar1;
  FailedAssertion *pFVar2;
  long lVar3;
  string local_48;
  
  rhs = (actual->
        super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  if ((long)(actual->
            super__Vector_base<agge::tests::mocks::coords_pair<float>,_std::allocator<agge::tests::mocks::coords_pair<float>_>_>
            )._M_impl.super__Vector_impl_data._M_finish - (long)rhs != 0x20) {
    pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Values are not equal!","");
    FailedAssertion::FailedAssertion(pFVar2,&local_48,location);
    __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
  }
  bVar1 = agge::tests::mocks::coords_pair<float>::operator==(*expected,rhs);
  if (bVar1) {
    lVar3 = 0;
    do {
      if (lVar3 == 0x10) {
        return;
      }
      bVar1 = agge::tests::mocks::coords_pair<float>::operator==
                        ((coords_pair<float> *)((long)&(*expected)[1].x1 + lVar3),
                         (coords_pair<float> *)((long)&rhs[1].x1 + lVar3));
      lVar3 = lVar3 + 0x10;
    } while (bVar1);
  }
  pFVar2 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Value is not \'true\'!","");
  FailedAssertion::FailedAssertion(pFVar2,&local_48,location);
  __cxa_throw(pFVar2,&FailedAssertion::typeinfo,FailedAssertion::~FailedAssertion);
}

Assistant:

inline void are_equal(T (&expected)[n], const ContainerT &actual, const LocationInfo &location)
	{
		are_equal(n, static_cast<size_t>(std::distance(actual.begin(), actual.end())), location);
		is_true(std::equal(expected, expected + n, actual.begin()), location);
	}